

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O0

void color_Source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  int in_ECX;
  uint32_t in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  int ialpha;
  uint32_t in_stack_0000002c;
  uint32_t in_stack_00000030;
  int in_stack_00000034;
  uint32_t *in_stack_00000038;
  
  if (in_ECX == 0xff) {
    memfill32(in_RDI,in_EDX,in_ESI);
  }
  else {
    copy_helper_sse2(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
  }
  return;
}

Assistant:

static void color_Source(uint32_t *dest, int length, uint32_t color,
                         uint32_t alpha)
{
    int ialpha, i;

    if (alpha == 255) {
        memfill32(dest, color, length);
    } else {
        ialpha = 255 - alpha;
        color = BYTE_MUL(color, alpha);
        for (i = 0; i < length; ++i)
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}